

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBeamSectionCosserat.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElasticityCosseratMesh::ComputeStress
          (ChElasticityCosseratMesh *this,ChVector<double> *stress_n,ChVector<double> *stress_m,
          ChVector<double> *strain_n,ChVector<double> *strain_m)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  int iVar14;
  int iVar15;
  int iVar16;
  pointer pCVar17;
  pointer pCVar18;
  pointer pCVar19;
  pointer pCVar20;
  long lVar21;
  uint uVar22;
  ulong uVar23;
  size_type __n;
  ulong uVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  shared_ptr<chrono::fea::ChElasticityCosseratMesh::ChSectionMaterial> mmat;
  vector<double,_std::allocator<double>_> sigma_xy;
  vector<double,_std::allocator<double>_> sigma_xx;
  vector<double,_std::allocator<double>_> sigma_xz;
  vector<double,_std::allocator<double>_> gamma_xz;
  vector<double,_std::allocator<double>_> gamma_xy;
  vector<double,_std::allocator<double>_> epsilon_xx;
  
  pCVar17 = (this->triangles).
            super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  pCVar18 = (this->triangles).
            super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>.
            _M_impl.super__Vector_impl_data._M_start;
  uVar22 = (uint)((ulong)((long)(this->vertexes).
                                super__Vector_base<chrono::ChVector2<double>,_std::allocator<chrono::ChVector2<double>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->vertexes).
                               super__Vector_base<chrono::ChVector2<double>,_std::allocator<chrono::ChVector2<double>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 4);
  __n = (size_type)(int)uVar22;
  std::vector<double,_std::allocator<double>_>::vector(&epsilon_xx,__n,(allocator_type *)&gamma_xy);
  std::vector<double,_std::allocator<double>_>::vector(&gamma_xy,__n,(allocator_type *)&gamma_xz);
  std::vector<double,_std::allocator<double>_>::vector(&gamma_xz,__n,(allocator_type *)&sigma_xx);
  std::vector<double,_std::allocator<double>_>::vector(&sigma_xx,__n,(allocator_type *)&sigma_xy);
  std::vector<double,_std::allocator<double>_>::vector(&sigma_xy,__n,(allocator_type *)&sigma_xz);
  std::vector<double,_std::allocator<double>_>::vector(&sigma_xz,__n,(allocator_type *)&mmat);
  lVar21 = 8;
  for (uVar24 = 0; (~((int)uVar22 >> 0x1f) & uVar22) != uVar24; uVar24 = uVar24 + 1) {
    mmat.
    super___shared_ptr<chrono::fea::ChElasticityCosseratMesh::ChSectionMaterial,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    mmat.
    super___shared_ptr<chrono::fea::ChElasticityCosseratMesh::ChSectionMaterial,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    uVar23 = uVar24;
    if (*(long *)&this->field_0x30 - *(long *)&this->materials == 0x10) {
      uVar23 = 0;
    }
    std::
    __shared_ptr<chrono::fea::ChElasticityCosseratMesh::ChSectionMaterial,_(__gnu_cxx::_Lock_policy)2>
    ::operator=(&mmat.
                 super___shared_ptr<chrono::fea::ChElasticityCosseratMesh::ChSectionMaterial,_(__gnu_cxx::_Lock_policy)2>
                ,(__shared_ptr<chrono::fea::ChElasticityCosseratMesh::ChSectionMaterial,_(__gnu_cxx::_Lock_policy)2>
                  *)(uVar23 * 0x10 + *(long *)&this->materials));
    pCVar19 = (this->vertexes).
              super__Vector_base<chrono::ChVector2<double>,_std::allocator<chrono::ChVector2<double>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    auVar42._8_8_ = 0;
    auVar42._0_8_ = strain_m->m_data[1];
    dVar1 = *(double *)((long)pCVar19->m_data + lVar21);
    auVar38._8_8_ = 0;
    auVar38._0_8_ = dVar1;
    dVar2 = *(double *)((long)pCVar19->m_data + lVar21 + -8);
    auVar34._8_8_ = 0;
    auVar34._0_8_ = dVar2;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = strain_n->m_data[0];
    auVar10 = vfmadd213sd_fma(auVar42,auVar38,auVar10);
    auVar11._8_8_ = 0;
    auVar11._0_8_ = strain_m->m_data[2];
    auVar10 = vfnmadd231sd_fma(auVar10,auVar34,auVar11);
    epsilon_xx.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[uVar24] = auVar10._0_8_;
    auVar43._8_8_ = 0;
    auVar43._0_8_ = strain_m->m_data[0];
    auVar12._8_8_ = 0;
    auVar12._0_8_ = strain_n->m_data[1];
    auVar39._8_8_ = 0;
    auVar39._0_8_ = 0.0 - dVar1;
    auVar10 = vfmadd213sd_fma(auVar39,auVar43,auVar12);
    gamma_xy.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[uVar24] = auVar10._0_8_;
    auVar40._8_8_ = 0;
    auVar40._0_8_ = strain_m->m_data[0];
    auVar13._8_8_ = 0;
    auVar13._0_8_ = strain_n->m_data[2];
    auVar35._8_8_ = 0;
    auVar35._0_8_ = dVar2 + 0.0;
    auVar10 = vfmadd213sd_fma(auVar35,auVar40,auVar13);
    gamma_xz.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[uVar24] = auVar10._0_8_;
    sigma_xx.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[uVar24] =
         *(double *)
          mmat.
          super___shared_ptr<chrono::fea::ChElasticityCosseratMesh::ChSectionMaterial,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr *
         epsilon_xx.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start[uVar24];
    sigma_xy.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[uVar24] =
         *(double *)
          (mmat.
           super___shared_ptr<chrono::fea::ChElasticityCosseratMesh::ChSectionMaterial,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr + 8) *
         gamma_xy.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start[uVar24];
    sigma_xz.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[uVar24] =
         *(double *)
          (mmat.
           super___shared_ptr<chrono::fea::ChElasticityCosseratMesh::ChSectionMaterial,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr + 8) *
         gamma_xz.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start[uVar24];
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&mmat.
                super___shared_ptr<chrono::fea::ChElasticityCosseratMesh::ChSectionMaterial,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    lVar21 = lVar21 + 0x10;
  }
  if (stress_n != (ChVector<double> *)&VNULL) {
    stress_n->m_data[0] = VNULL;
    stress_n->m_data[1] = DAT_011dd3e0;
    stress_n->m_data[2] = DAT_011dd3e8;
  }
  if (stress_m != (ChVector<double> *)&VNULL) {
    stress_m->m_data[0] = VNULL;
    stress_m->m_data[1] = DAT_011dd3e0;
    stress_m->m_data[2] = DAT_011dd3e8;
  }
  auVar11 = _DAT_00e88fe0;
  auVar10 = _DAT_00e88fd0;
  auVar41._8_8_ = 0x7fffffffffffffff;
  auVar41._0_8_ = 0x7fffffffffffffff;
  auVar44._8_8_ = 0x4038000000000000;
  auVar44._0_8_ = 0x4038000000000000;
  auVar45._8_8_ = 0x4028000000000000;
  auVar45._0_8_ = 0x4028000000000000;
  pCVar19 = (this->vertexes).
            super__Vector_base<chrono::ChVector2<double>,_std::allocator<chrono::ChVector2<double>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pCVar20 = (this->triangles).
            super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>.
            _M_impl.super__Vector_impl_data._M_start;
  uVar22 = (uint)(((long)pCVar17 - (long)pCVar18) / 0xc);
  lVar21 = 0;
  while ((ulong)(~((int)uVar22 >> 0x1f) & uVar22) * 0xc - lVar21 != 0) {
    iVar14 = *(int *)((long)pCVar20->m_data + lVar21);
    iVar15 = *(int *)((long)pCVar20->m_data + lVar21 + 8);
    iVar16 = *(int *)((long)pCVar20->m_data + lVar21 + 4);
    lVar21 = lVar21 + 0xc;
    dVar1 = sigma_xx.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[iVar14];
    auVar46._8_8_ = 0;
    auVar46._0_8_ = dVar1;
    dVar2 = sigma_xy.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[iVar14];
    auVar29._8_8_ = 0;
    auVar29._0_8_ =
         sigma_xz.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start[iVar14];
    auVar25 = vmovddup_avx512vl(auVar29);
    dVar3 = sigma_xx.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[iVar15];
    auVar48._8_8_ = 0;
    auVar48._0_8_ = dVar3;
    dVar4 = sigma_xz.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[iVar15];
    dVar5 = sigma_xx.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[iVar16];
    auVar47._8_8_ = 0;
    auVar47._0_8_ = dVar5;
    dVar6 = sigma_xz.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[iVar16];
    auVar26._8_8_ = 0;
    auVar26._0_8_ = pCVar19[iVar15].m_data[1];
    auVar26 = vmovddup_avx512vl(auVar26);
    auVar27._8_8_ = 0;
    auVar27._0_8_ = pCVar19[iVar14].m_data[1];
    auVar27 = vmovddup_avx512vl(auVar27);
    auVar28._8_8_ = 0;
    auVar28._0_8_ = pCVar19[iVar16].m_data[1];
    auVar28 = vmovddup_avx512vl(auVar28);
    dVar7 = pCVar19[iVar16].m_data[0];
    auVar50._8_8_ = 0;
    auVar50._0_8_ = dVar7;
    dVar8 = pCVar19[iVar14].m_data[0];
    auVar49._8_8_ = 0;
    auVar49._0_8_ = dVar8;
    dVar9 = pCVar19[iVar15].m_data[0];
    auVar51._8_8_ = 0;
    auVar51._0_8_ = dVar9;
    auVar56._8_8_ = 0;
    auVar56._0_8_ =
         sigma_xy.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start[iVar16];
    auVar29 = vunpcklpd_avx512vl(auVar47,auVar56);
    auVar53._8_8_ = 0;
    auVar53._0_8_ = dVar2;
    auVar30 = vunpcklpd_avx512vl(auVar46,auVar53);
    auVar31 = vunpcklpd_avx512vl(auVar56,auVar47);
    auVar32 = vsubsd_avx512f(auVar26,auVar27);
    auVar33 = vsubsd_avx512f(auVar28,auVar26);
    auVar29 = vaddpd_avx512vl(auVar30,auVar29);
    auVar55._8_8_ = 0;
    auVar55._0_8_ =
         sigma_xy.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start[iVar15];
    auVar30 = vunpcklpd_avx512vl(auVar48,auVar55);
    auVar32 = vmulsd_avx512f(auVar50,auVar32);
    auVar30 = vaddpd_avx512vl(auVar29,auVar30);
    auVar29 = vfmadd231sd_avx512f(auVar32,auVar49,auVar33);
    auVar32 = vsubsd_avx512f(auVar27,auVar28);
    auVar29 = vfmadd213sd_avx512f(auVar32,auVar51,auVar29);
    auVar29 = vmulsd_avx512f(auVar29,ZEXT816(0x3fe0000000000000));
    auVar29 = vandpd_avx(auVar29,auVar41);
    auVar32 = vmulsd_avx512f(auVar29,ZEXT816(0x3fd5555555555555));
    auVar33 = vmovddup_avx512vl(auVar32);
    auVar30 = vfmadd213pd_avx512vl(auVar33,auVar30,*(undefined1 (*) [16])stress_n->m_data);
    auVar57._8_8_ = 0;
    auVar57._0_8_ = dVar6;
    auVar33 = vaddsd_avx512f(auVar25,auVar57);
    auVar59._8_8_ = 0;
    auVar59._0_8_ = dVar4;
    auVar33 = vaddsd_avx512f(auVar33,auVar59);
    *(undefined1 (*) [16])stress_n->m_data = auVar30;
    auVar30._8_8_ = 0;
    auVar30._0_8_ = stress_n->m_data[2];
    auVar30 = vfmadd213sd_avx512f(auVar33,auVar32,auVar30);
    auVar32 = vunpcklpd_avx512vl(auVar49,auVar50);
    vmovsd_avx512f(auVar30);
    stress_n->m_data[2] = stress_n->m_data[2];
    auVar30 = vmulpd_avx512vl(auVar32,auVar25);
    auVar25 = vunpcklpd_avx512vl(auVar25,auVar57);
    auVar30 = vdivpd_avx512vl(auVar30,auVar10);
    auVar33 = vunpcklpd_avx512vl(auVar51,auVar49);
    auVar25 = vmulpd_avx512vl(auVar33,auVar25);
    auVar25 = vdivpd_avx512vl(auVar25,auVar44);
    auVar36._0_8_ = auVar30._0_8_ + auVar30._8_8_;
    auVar36._8_8_ = auVar30._0_8_ + auVar30._8_8_;
    auVar30 = vshufpd_avx512vl(auVar25,auVar25,1);
    auVar30 = vaddpd_avx512vl(auVar36,auVar30);
    auVar30 = vaddpd_avx512vl(auVar25,auVar30);
    auVar58._8_8_ = 0;
    auVar58._0_8_ = dVar6;
    auVar25 = vunpcklpd_avx512vl(auVar59,auVar58);
    auVar32 = vmulpd_avx512vl(auVar32,auVar25);
    auVar32 = vdivpd_avx512vl(auVar32,auVar11);
    auVar33 = vshufpd_avx512vl(auVar32,auVar32,1);
    auVar30 = vaddpd_avx512vl(auVar33,auVar30);
    auVar30 = vaddpd_avx512vl(auVar32,auVar30);
    auVar32 = vunpcklpd_avx512vl(auVar50,auVar51);
    auVar25 = vmulpd_avx512vl(auVar32,auVar25);
    auVar25 = vdivpd_avx512vl(auVar25,auVar44);
    auVar32 = vshufpd_avx512vl(auVar25,auVar25,1);
    auVar30 = vaddpd_avx512vl(auVar32,auVar30);
    auVar60._8_8_ = 0;
    auVar60._0_8_ = dVar4;
    auVar32 = vunpcklpd_avx512vl(auVar60,auVar53);
    auVar54._8_8_ = 0;
    auVar54._0_8_ = dVar2;
    auVar33 = vunpcklpd_avx512vl(auVar54,auVar46);
    auVar30 = vaddpd_avx512vl(auVar25,auVar30);
    auVar25 = vunpcklpd_avx512vl(auVar51,auVar27);
    auVar25 = vmulpd_avx512vl(auVar25,auVar32);
    auVar32 = vmulpd_avx512vl(auVar28,auVar33);
    auVar33 = vmulpd_avx512vl(auVar26,auVar33);
    auVar25 = vdivpd_avx512vl(auVar25,auVar45);
    auVar32 = vdivpd_avx512vl(auVar32,auVar44);
    auVar33 = vdivpd_avx512vl(auVar33,auVar44);
    auVar30 = vaddpd_avx512vl(auVar25,auVar30);
    auVar25 = vshufpd_avx512vl(auVar25,auVar25,1);
    auVar30 = vsubpd_avx512vl(auVar30,auVar25);
    auVar25 = vmulsd_avx512f(auVar27,auVar46);
    auVar25 = vdivsd_avx512f(auVar25,ZEXT816(0x4028000000000000));
    auVar30 = vsubpd_avx512vl(auVar30,auVar32);
    auVar25 = vmovddup_avx512vl(auVar25);
    auVar25 = vaddpd_avx512vl(auVar25,auVar32);
    auVar32 = vmulpd_avx512vl(auVar27,auVar31);
    auVar32 = vdivpd_avx512vl(auVar32,auVar44);
    auVar30 = vsubpd_avx512vl(auVar30,auVar32);
    auVar25 = vaddpd_avx512vl(auVar25,auVar32);
    auVar32 = vunpcklpd_avx512vl(auVar55,auVar48);
    auVar27 = vmulpd_avx512vl(auVar27,auVar32);
    auVar30 = vsubpd_avx512vl(auVar30,auVar33);
    auVar25 = vaddpd_avx512vl(auVar25,auVar33);
    auVar27 = vdivpd_avx512vl(auVar27,auVar44);
    auVar33._0_8_ = auVar30._0_8_;
    auVar33._8_8_ = auVar25._8_8_;
    auVar30 = vmulpd_avx512vl(auVar28,auVar31);
    auVar28 = vmulpd_avx512vl(auVar28,auVar32);
    auVar30 = vdivpd_avx512vl(auVar30,auVar45);
    auVar28 = vdivpd_avx512vl(auVar28,auVar44);
    auVar25 = vsubpd_avx512vl(auVar33,auVar30);
    auVar30 = vaddpd_avx512vl(auVar33,auVar30);
    auVar25 = vsubpd_avx512vl(auVar25,auVar27);
    auVar27 = vaddpd_avx512vl(auVar30,auVar27);
    auVar30 = vmulpd_avx512vl(auVar26,auVar31);
    auVar26 = vmulpd_avx512vl(auVar26,auVar32);
    auVar30 = vdivpd_avx512vl(auVar30,auVar44);
    auVar26 = vdivpd_avx512vl(auVar26,auVar45);
    auVar27 = vaddpd_avx512vl(auVar27,auVar30);
    auVar30 = vsubpd_avx512vl(auVar25,auVar30);
    auVar27 = vaddpd_avx512vl(auVar27,auVar28);
    auVar28 = vsubpd_avx512vl(auVar30,auVar28);
    auVar28 = vsubpd_avx512vl(auVar28,auVar26);
    auVar26 = vaddpd_avx512vl(auVar27,auVar26);
    auVar52._8_8_ = 0;
    auVar52._0_8_ = auVar29._0_8_ + auVar29._0_8_;
    auVar29 = vmovddup_avx512vl(auVar52);
    auVar31._0_8_ = auVar28._0_8_;
    auVar31._8_8_ = auVar26._8_8_;
    auVar29 = vfmadd213pd_avx512vl(auVar29,auVar31,*(undefined1 (*) [16])stress_m->m_data);
    auVar32._0_8_ = (dVar8 * dVar1) / 12.0;
    auVar32._8_8_ = 0;
    *(undefined1 (*) [16])stress_m->m_data = auVar29;
    auVar29 = vmulsd_avx512f(auVar50,auVar46);
    auVar29 = vdivsd_avx512f(auVar29,ZEXT816(0x4038000000000000));
    auVar29 = vaddsd_avx512f(auVar32,auVar29);
    auVar26 = vmulsd_avx512f(auVar49,auVar47);
    auVar26 = vdivsd_avx512f(auVar26,ZEXT816(0x4038000000000000));
    auVar29 = vaddsd_avx512f(auVar29,auVar26);
    auVar25._8_8_ = 0;
    auVar25._0_8_ = stress_m->m_data[2];
    auVar37._8_8_ = 0;
    auVar37._0_8_ =
         (dVar9 * dVar3) / 12.0 +
         (dVar7 * dVar3) / 24.0 +
         (dVar9 * dVar5) / 24.0 +
         (dVar8 * dVar3) / 24.0 + (dVar7 * dVar5) / 12.0 + (dVar9 * dVar1) / 24.0 + auVar29._0_8_;
    auVar29 = vfnmadd213sd_fma(auVar37,auVar52,auVar25);
    stress_m->m_data[2] = auVar29._0_8_;
  }
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&sigma_xz.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&sigma_xy.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&sigma_xx.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&gamma_xz.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&gamma_xy.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&epsilon_xx.super__Vector_base<double,_std::allocator<double>_>);
  return;
}

Assistant:

void ChElasticityCosseratMesh::ComputeStress(ChVector<>& stress_n,
                                             ChVector<>& stress_m,
                                             const ChVector<>& strain_n,
                                             const ChVector<>& strain_m) {
    int nv = (int)this->vertexes.size();
    int nt = (int)this->triangles.size();

    // temp per-vertex data for point strains:
    std::vector<double> epsilon_xx(nv);
    std::vector<double> gamma_xy(nv);
    std::vector<double> gamma_xz(nv);

    // temp per-vertex data for point stresses:
    std::vector<double> sigma_xx(nv);
    std::vector<double> sigma_xy(nv);
    std::vector<double> sigma_xz(nv);

    double warp_dy = 0;  // to do
    double warp_dz = 0;  // to do

    for (int i = 0; i < nv; ++i) {
        std::shared_ptr<ChSectionMaterial> mmat;
        if (materials.size() == 1)
            mmat = materials[0];
        else
            mmat = materials[i];

        double vy = vertexes[i][0];
        double vz = vertexes[i][1];
        epsilon_xx[i] = strain_n.x() + strain_m.y() * vz - strain_m.z() * vy;
        gamma_xy[i] = strain_n.y() + strain_m.x() * (warp_dy - vz);
        gamma_xz[i] = strain_n.z() + strain_m.x() * (warp_dz + vy);
        // simple linear elastic model:
        sigma_xx[i] = mmat->E * epsilon_xx[i];
        sigma_xy[i] = mmat->G * gamma_xy[i];
        sigma_xz[i] = mmat->G * gamma_xz[i];
    }

    // integrate on triangles, assuming linear interpolation of vertex values
    stress_n = VNULL;
    stress_m = VNULL;
    for (int t = 0; t < nt; ++t) {
        size_t iv1 = triangles[t].x();
        size_t iv2 = triangles[t].y();
        size_t iv3 = triangles[t].z();
        double y1 = this->vertexes[iv1][0];
        double z1 = this->vertexes[iv1][1];
        double y2 = this->vertexes[iv2][0];
        double z2 = this->vertexes[iv2][1];
        double y3 = this->vertexes[iv3][0];
        double z3 = this->vertexes[iv3][1];

        double A = fabs(0.5 * ((y1 * (z2 - z3) + y2 * (z3 - z1) + y3 * (z1 - z2))));

        double s1 = sigma_xx[iv1];
        double s2 = sigma_xx[iv2];
        double s3 = sigma_xx[iv3];
        double sxz1 = sigma_xz[iv1];
        double sxz2 = sigma_xz[iv2];
        double sxz3 = sigma_xz[iv3];
        double sxy1 = sigma_xy[iv1];
        double sxy2 = sigma_xy[iv2];
        double sxy3 = sigma_xy[iv3];

        stress_n.x() += (1. / 3.) * A * (s1 + s2 + s3);
        stress_n.y() += (1. / 3.) * A * (sxy1 + sxy2 + sxy3);
        stress_n.z() += (1. / 3.) * A * (sxz1 + sxz2 + sxz3);

        stress_m.x() +=
            2. * A *
            ((sxz1 * y1) / 12. + (sxz1 * y2) / 24. + (sxz2 * y1) / 24. + (sxz1 * y3) / 24. + (sxz2 * y2) / 12. +
             (sxz3 * y1) / 24. + (sxz2 * y3) / 24. + (sxz3 * y2) / 24. + (sxz3 * y3) / 12. - (sxy1 * z1) / 12. -
             (sxy1 * z2) / 24. - (sxy2 * z1) / 24. - (sxy1 * z3) / 24. - (sxy2 * z2) / 12. - (sxy3 * z1) / 24. -
             (sxy2 * z3) / 24. - (sxy3 * z2) / 24. - (sxy3 * z3) / 12.);
        stress_m.y() += 2. * A *
                        ((s1 * z1) / 12. + (s1 * z2) / 24. + (s2 * z1) / 24. + (s1 * z3) / 24. + (s2 * z2) / 12. +
                         (s3 * z1) / 24. + (s2 * z3) / 24. + (s3 * z2) / 24. + (s3 * z3) / 12.);
        stress_m.z() -= 2. * A *
                        ((s1 * y1) / 12. + (s1 * y2) / 24. + (s2 * y1) / 24. + (s1 * y3) / 24. + (s2 * y2) / 12. +
                         (s3 * y1) / 24. + (s2 * y3) / 24. + (s3 * y2) / 24. + (s3 * y3) / 12.);
    }
}